

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Box(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var9;
  CX3DImporter_NodeElement *pParentElement;
  string *psVar10;
  int pAttrIdx;
  ulong uVar11;
  CX3DImporter_NodeElement *ne;
  string an;
  string use;
  string def;
  bool local_b2;
  allocator local_b1;
  CX3DImporter_NodeElement *local_b0;
  uint local_a4;
  aiVector3D local_a0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_a0.x = 2.0;
  local_a0.y = 2.0;
  local_a0.z = 2.0;
  local_b0 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar7 < 1) {
    local_b2 = true;
  }
  else {
    uVar11 = 0;
    local_b2 = true;
    local_a4 = uVar7;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar11;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar11);
      std::__cxx11::string::string
                ((string *)&local_90,(char *)CONCAT44(extraout_var,iVar8),&local_b1);
      iVar8 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar10 = &local_50;
LAB_007221a7:
        pcVar3 = (char *)psVar10->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)__s);
        uVar7 = local_a4;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar10 = &local_70;
          goto LAB_007221a7;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_90);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_90), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_90), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar8 == 0) {
            XML_ReadNode_GetAttrVal_AsVec3f(this,pAttrIdx,&local_a0);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar8 == 0) {
              local_b2 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              Throw_IncorrectAttr(this,&local_90);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      uVar11 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
  }
  if (local_70._M_string_length == 0) {
    pParentElement = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar4 = this->NodeElement_Cur;
    pParentElement->Type = ENET_Box;
    (pParentElement->ID)._M_dataplus._M_p = (pointer)&(pParentElement->ID).field_2;
    (pParentElement->ID)._M_string_length = 0;
    (pParentElement->ID).field_2._M_local_buf[0] = '\0';
    pParentElement->Parent = pCVar4;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pParentElement->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry3D_009b3848;
    pCVar4 = pParentElement + 1;
    *(CX3DImporter_NodeElement **)&pParentElement[1].Type = pCVar4;
    pParentElement[1]._vptr_CX3DImporter_NodeElement = (_func_int **)pCVar4;
    pParentElement[1].ID._M_dataplus._M_p = (pointer)0x0;
    pParentElement[1].ID._M_string_length = 0;
    pParentElement[1].ID.field_2._M_local_buf[0] = '\x01';
    local_b0 = pParentElement;
    if (local_50._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&pParentElement->ID);
    }
    GeometryHelper_MakeQL_RectParallelepiped
              (this,&local_a0,(list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar4
              );
    pParentElement[1].ID.field_2._M_local_buf[0] = local_b2;
    pParentElement[1].ID._M_string_length = 4;
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar8 == '\0') {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Box","");
      ParseNode_Metadata(this,pParentElement,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)pParentElement;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)pParentElement;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_50._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_70,ENET_Box,&local_b0);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_70);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_b0;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Box()
{
    std::string def, use;
    bool solid = true;
    aiVector3D size(2, 2, 2);
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("size", size, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Box, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry3D(CX3DImporter_NodeElement::ENET_Box, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		GeometryHelper_MakeQL_RectParallelepiped(size, ((CX3DImporter_NodeElement_Geometry3D*)ne)->Vertices);// get quad list
		((CX3DImporter_NodeElement_Geometry3D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry3D*)ne)->NumIndices = 4;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Box");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}